

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall
cmake::Build(cmake *this,int jobs,string *dir,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *targets,string *config,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *nativeOptions,cmBuildOptions *buildOptions,bool verbose,string *presetName,
            bool listPresets)

{
  _Base_ptr __k;
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  cmState *pcVar3;
  cmGlobalGenerator *pcVar4;
  const_iterator cVar5;
  bool bVar6;
  ReadFileResult result;
  int iVar7;
  int iVar8;
  undefined8 extraout_RAX;
  string *psVar9;
  iterator iVar10;
  iterator iVar11;
  cmValue cVar12;
  ostream *poVar13;
  undefined7 uVar14;
  undefined4 in_register_00000034;
  string local_908;
  undefined4 local_8e8;
  allocator<char> local_8e2;
  allocator<char> local_8e1;
  ulong local_8e0;
  _Head_base<0UL,_cmGlobalGenerator_*,_false> local_8d8;
  undefined1 local_8d0 [8];
  string cachePath;
  string projName;
  string local_848;
  string output;
  undefined1 local_808 [32];
  _Any_data local_7e8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
  local_7d8;
  _Rb_tree_node_base local_7a0;
  size_t local_780;
  _Rb_tree_node_base local_770;
  _Base_ptr local_750;
  _Rb_tree_node_base local_740;
  pointer local_720;
  pointer pbStack_718;
  pointer local_710;
  pointer pbStack_708;
  __node_base local_700;
  pointer pbStack_6f8;
  pointer local_6f0;
  pointer pbStack_6e8;
  pointer local_6e0;
  pointer pbStack_6d8;
  pointer local_6d0;
  __node_base _Stack_6c8;
  pointer local_6c0;
  pointer pbStack_6b8;
  pointer local_6b0;
  pointer pbStack_6a8;
  _Alloc_hider local_6a0;
  size_type local_698;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_690;
  _Base_ptr local_680;
  pointer puStack_678;
  pointer local_670;
  
  local_8e0 = CONCAT44(in_register_00000034,jobs);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&output,"",(allocator<char> *)&cachePath);
  SetHomeDirectory(this,&output);
  std::__cxx11::string::~string((string *)&output);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&output,"",(allocator<char> *)&cachePath);
  SetHomeOutputDirectory(this,&output);
  local_8e8 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),verbose);
  std::__cxx11::string::~string((string *)&output);
  if (presetName->_M_string_length != 0 || listPresets) {
    cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
    SetHomeDirectory(this,&output);
    std::__cxx11::string::~string((string *)&output);
    cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
    SetHomeOutputDirectory(this,&output);
    std::__cxx11::string::~string((string *)&output);
    output._M_dataplus._M_p = (pointer)&output.field_2;
    output._M_string_length = 0;
    output.field_2._M_local_buf[0] = '\0';
    p_Var1 = (_Base_ptr)(local_808 + 8);
    local_808._8_4_ = _S_red;
    local_808._16_8_ = (_Base_ptr)0x0;
    local_7e8._8_8_ = 0;
    p_Var2 = &local_7d8._M_impl.super__Rb_tree_header;
    local_7d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_7d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_7d8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_7a0._M_left = &local_7a0;
    local_7a0._M_color = _S_red;
    local_7a0._M_parent = (_Base_ptr)0x0;
    local_780 = 0;
    local_770._M_left = &local_770;
    local_770._M_color = _S_red;
    local_770._M_parent = (_Base_ptr)0x0;
    local_750 = (_Base_ptr)0x0;
    local_740._M_left = &local_740;
    local_740._M_color = _S_red;
    local_740._M_parent = (_Base_ptr)0x0;
    local_6a0._M_p = (pointer)&local_690;
    local_6b0 = (pointer)0x0;
    pbStack_6a8 = (pointer)0x0;
    local_6c0 = (pointer)0x0;
    pbStack_6b8 = (pointer)0x0;
    local_6d0 = (pointer)0x0;
    _Stack_6c8._M_nxt = (_Hash_node_base *)0x0;
    local_6e0 = (pointer)0x0;
    pbStack_6d8 = (pointer)0x0;
    local_6f0 = (pointer)0x0;
    pbStack_6e8 = (pointer)0x0;
    local_700._M_nxt = (_Hash_node_base *)0x0;
    pbStack_6f8 = (pointer)0x0;
    local_710 = (pointer)0x0;
    pbStack_708 = (pointer)0x0;
    local_720 = (pointer)0x0;
    pbStack_718 = (pointer)0x0;
    local_698 = 0;
    local_690._M_local_buf[0] = '\0';
    local_680 = (_Base_ptr)0x0;
    puStack_678 = (pointer)0x0;
    local_670 = (pointer)0x0;
    local_808._24_8_ = p_Var1;
    local_7e8._M_unused._M_object = p_Var1;
    local_7d8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_7d8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    local_7a0._M_right = local_7a0._M_left;
    local_770._M_right = local_770._M_left;
    local_740._M_right = local_740._M_left;
    psVar9 = GetHomeDirectory_abi_cxx11_(this);
    result = cmCMakePresetsGraph::ReadProjectPresets((cmCMakePresetsGraph *)&output,psVar9,false);
    if (result == READ_OK) {
      if (listPresets) {
        bVar6 = false;
        cmCMakePresetsGraph::PrintBuildPresetList
                  ((cmCMakePresetsGraph *)&output,(PrintPrecedingNewline *)0x0);
        iVar8 = 0;
      }
      else {
        iVar10 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
                 ::find(&local_7d8,presetName);
        if ((_Rb_tree_header *)iVar10._M_node == p_Var2) {
          cachePath._M_dataplus._M_p = &DAT_00000018;
          cachePath._M_string_length = (size_type)anon_var_dwarf_45a54f;
          psVar9 = GetHomeDirectory_abi_cxx11_(this);
          projName._M_string_length = (size_type)(psVar9->_M_dataplus)._M_p;
          projName._M_dataplus._M_p = (pointer)psVar9->_M_string_length;
          local_848._M_dataplus._M_p._0_1_ = 0x22;
          cmStrCat<char[4],std::__cxx11::string,char>
                    (&local_908,(cmAlphaNum *)&cachePath,(cmAlphaNum *)&projName,
                     (char (*) [4])0x5c48bd,presetName,(char *)&local_848);
          cmSystemTools::Error(&local_908);
LAB_001f0063:
          std::__cxx11::string::~string((string *)&local_908);
          cmCMakePresetsGraph::PrintBuildPresetList
                    ((cmCMakePresetsGraph *)&output,(PrintPrecedingNewline *)0x0);
        }
        else {
          if ((char)iVar10._M_node[4]._M_color == _S_black) {
            cachePath._M_dataplus._M_p = (pointer)0x22;
            cachePath._M_string_length = (size_type)anon_var_dwarf_45a55c;
            psVar9 = GetHomeDirectory_abi_cxx11_(this);
            projName._M_string_length = (size_type)(psVar9->_M_dataplus)._M_p;
            projName._M_dataplus._M_p = (pointer)psVar9->_M_string_length;
            local_848._M_dataplus._M_p._0_1_ = 0x22;
            cmStrCat<char[4],std::__cxx11::string,char>
                      (&local_908,(cmAlphaNum *)&cachePath,(cmAlphaNum *)&projName,
                       (char (*) [4])0x5c48bd,presetName,(char *)&local_848);
            cmSystemTools::Error(&local_908);
            goto LAB_001f0063;
          }
          if (*(char *)&iVar10._M_node[0x18]._M_left == '\0') {
            cachePath._M_dataplus._M_p = (pointer)0x21;
            cachePath._M_string_length = (size_type)anon_var_dwarf_45a569;
            projName._M_string_length = (size_type)(presetName->_M_dataplus)._M_p;
            projName._M_dataplus._M_p = (pointer)presetName->_M_string_length;
            cmStrCat<char[27]>(&local_908,(cmAlphaNum *)&cachePath,(cmAlphaNum *)&projName,
                               (char (*) [27])"\": Invalid macro expansion");
            cmSystemTools::Error(&local_908);
          }
          else {
            if (*(char *)&iVar10._M_node[0x12]._M_parent != '\0') {
              __k = iVar10._M_node + 0x14;
              iVar11 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                               *)local_808,__k);
              if (iVar11._M_node == p_Var1) {
                cachePath._M_dataplus._M_p = (pointer)0x1c;
                cachePath._M_string_length = (size_type)anon_var_dwarf_45a583;
                psVar9 = GetHomeDirectory_abi_cxx11_(this);
                projName._M_string_length = (size_type)(psVar9->_M_dataplus)._M_p;
                projName._M_dataplus._M_p = (pointer)psVar9->_M_string_length;
                local_848._M_dataplus._M_p._0_1_ = 0x22;
                cmStrCat<char[4],std::__cxx11::string,char>
                          (&local_908,(cmAlphaNum *)&cachePath,(cmAlphaNum *)&projName,
                           (char (*) [4])0x5c48bd,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k,
                           (char *)&local_848);
                cmSystemTools::Error(&local_908);
              }
              else {
                if ((char)iVar11._M_node[4]._M_color != _S_black) {
                  if ((char)iVar11._M_node[0x21]._M_color == _S_red) {
                    cachePath._M_dataplus._M_p = (pointer)0x25;
                    cachePath._M_string_length = (size_type)anon_var_dwarf_45a59d;
                    projName._M_string_length = *(size_type *)(iVar10._M_node + 0x14);
                    projName._M_dataplus._M_p = (pointer)iVar10._M_node[0x14]._M_parent;
                    cmStrCat<char[27]>(&local_908,(cmAlphaNum *)&cachePath,(cmAlphaNum *)&projName,
                                       (char (*) [27])"\": Invalid macro expansion");
                    cmSystemTools::Error(&local_908);
                    goto LAB_001eff3e;
                  }
                  if (*(long *)(iVar11._M_node + 0x1d) != 0) {
                    std::__cxx11::string::_M_assign((string *)dir);
                  }
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::operator=(&(this->UnprocessedPresetEnvironment)._M_t,
                              (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)&iVar10._M_node[0x12]._M_left);
                  ProcessPresetEnvironment(this);
                  if (((int)local_8e0 + 1U < 2) &&
                     (*(char *)&iVar10._M_node[0x15]._M_parent == '\x01')) {
                    local_8e0 = (ulong)*(uint *)&iVar10._M_node[0x15].field_0x4;
                  }
                  cVar5._M_current =
                       (targets->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
                  if (cVar5._M_current ==
                      (targets->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish) {
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               targets,cVar5,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               iVar10._M_node[0x15]._M_left,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               iVar10._M_node[0x15]._M_right);
                  }
                  psVar9 = config;
                  if (config->_M_string_length == 0) {
                    psVar9 = (string *)std::__cxx11::string::_M_assign((string *)config);
                  }
                  if ((buildOptions->Clean == false) &&
                     (*(char *)((long)&iVar10._M_node[0x17]._M_parent + 1) == '\x01')) {
                    psVar9 = (string *)
                             CONCAT71((int7)((ulong)psVar9 >> 8),
                                      *(bool *)&iVar10._M_node[0x17]._M_parent);
                    buildOptions->Clean = *(bool *)&iVar10._M_node[0x17]._M_parent;
                  }
                  if ((buildOptions->ResolveMode == Default) &&
                     (*(char *)((long)&iVar10._M_node[0x18]._M_parent + 4) == '\x01')) {
                    psVar9 = (string *)(ulong)*(PackageResolveMode *)&iVar10._M_node[0x18]._M_parent
                    ;
                    buildOptions->ResolveMode =
                         *(PackageResolveMode *)&iVar10._M_node[0x18]._M_parent;
                  }
                  bVar6 = true;
                  uVar14 = (undefined7)((ulong)psVar9 >> 8);
                  local_8e8 = (undefined4)CONCAT71(uVar14,1);
                  if (!verbose) {
                    if (*(char *)((long)&iVar10._M_node[0x17]._M_parent + 3) == '\x01') {
                      local_8e8 = (undefined4)
                                  CONCAT71(uVar14,*(undefined1 *)
                                                   ((long)&iVar10._M_node[0x17]._M_parent + 2));
                    }
                    else {
                      local_8e8 = 0;
                    }
                  }
                  cVar5._M_current =
                       (nativeOptions->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
                  iVar8 = 1;
                  if (cVar5._M_current ==
                      (nativeOptions->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish) {
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               nativeOptions,cVar5,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               iVar10._M_node[0x17]._M_left,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               iVar10._M_node[0x17]._M_right);
                  }
                  goto LAB_001f01ef;
                }
                cachePath._M_dataplus._M_p = (pointer)0x26;
                cachePath._M_string_length = (size_type)anon_var_dwarf_45a590;
                psVar9 = GetHomeDirectory_abi_cxx11_(this);
                projName._M_string_length = (size_type)(psVar9->_M_dataplus)._M_p;
                projName._M_dataplus._M_p = (pointer)psVar9->_M_string_length;
                local_848._M_dataplus._M_p._0_1_ = 0x22;
                cmStrCat<char[4],std::__cxx11::string,char>
                          (&local_908,(cmAlphaNum *)&cachePath,(cmAlphaNum *)&projName,
                           (char (*) [4])0x5c48bd,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k,
                           (char *)&local_848);
                cmSystemTools::Error(&local_908);
              }
              std::__cxx11::string::~string((string *)&local_908);
              PrintPresetList(this,(cmCMakePresetsGraph *)&output);
              goto LAB_001eff46;
            }
            cachePath._M_dataplus._M_p = (pointer)0x24;
            cachePath._M_string_length = (size_type)anon_var_dwarf_45a576;
            psVar9 = GetHomeDirectory_abi_cxx11_(this);
            projName._M_string_length = (size_type)(psVar9->_M_dataplus)._M_p;
            projName._M_dataplus._M_p = (pointer)psVar9->_M_string_length;
            local_848._M_dataplus._M_p._0_1_ = 0x22;
            cmStrCat<char[4],std::__cxx11::string,char>
                      (&local_908,(cmAlphaNum *)&cachePath,(cmAlphaNum *)&projName,
                       (char (*) [4])0x5c48bd,presetName,(char *)&local_848);
            cmSystemTools::Error(&local_908);
          }
          std::__cxx11::string::~string((string *)&local_908);
          cmCMakePresetsGraph::PrintBuildPresetList
                    ((cmCMakePresetsGraph *)&output,(PrintPrecedingNewline *)0x0);
        }
        bVar6 = false;
        iVar8 = 1;
      }
    }
    else {
      cachePath._M_dataplus._M_p = (pointer)0x1c;
      cachePath._M_string_length = (size_type)anon_var_dwarf_45347f;
      psVar9 = GetHomeDirectory_abi_cxx11_(this);
      projName._M_string_length = (size_type)(psVar9->_M_dataplus)._M_p;
      projName._M_dataplus._M_p = (pointer)psVar9->_M_string_length;
      local_848._M_dataplus._M_p = cmCMakePresetsGraph::ResultToString(result);
      cmStrCat<char[3],char_const*>
                (&local_908,(cmAlphaNum *)&cachePath,(cmAlphaNum *)&projName,(char (*) [3])0x5ae9f7,
                 (char **)&local_848);
      cmSystemTools::Error(&local_908);
LAB_001eff3e:
      std::__cxx11::string::~string((string *)&local_908);
LAB_001eff46:
      iVar8 = 1;
      bVar6 = false;
    }
LAB_001f01ef:
    cmCMakePresetsGraph::~cmCMakePresetsGraph((cmCMakePresetsGraph *)&output);
    if (!bVar6) {
      return iVar8;
    }
  }
  bVar6 = cmsys::SystemTools::FileIsDirectory(dir);
  if (!bVar6) {
    poVar13 = std::operator<<((ostream *)&std::cerr,"Error: ");
    poVar13 = std::operator<<(poVar13,(string *)dir);
    std::operator<<(poVar13," is not a directory\n");
    return 1;
  }
  FindCacheFile(&cachePath,dir);
  bVar6 = LoadCache(this,&cachePath);
  if (bVar6) {
    pcVar3 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&output,"CMAKE_GENERATOR",(allocator<char> *)&projName);
    cVar12 = cmState::GetCacheEntryValue(pcVar3,&output);
    std::__cxx11::string::~string((string *)&output);
    if (cVar12.Value != (string *)0x0) {
      iVar8 = 1;
      CreateGlobalGenerator((cmake *)local_8d0,(string *)this,SUB81(cVar12.Value,0));
      if (local_8d0 == (undefined1  [8])0x0) {
        poVar13 = std::operator<<((ostream *)&std::cerr,"Error: could not create CMAKE_GENERATOR \""
                                 );
        poVar13 = std::operator<<(poVar13,(string *)cVar12.Value);
        std::operator<<(poVar13,"\"\n");
      }
      else {
        local_8d8._M_head_impl = (cmGlobalGenerator *)local_8d0;
        local_8d0 = (undefined1  [8])0x0;
        SetGlobalGenerator(this,(unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                                 *)&local_8d8);
        if (local_8d8._M_head_impl != (cmGlobalGenerator *)0x0) {
          (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                       *)&(local_8d8._M_head_impl)->_vptr_cmGlobalGenerator)->
                    super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                    )._M_t.
                    super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                    .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[1].
                    _vptr_cmGlobalGeneratorFactory)();
        }
        local_8d8._M_head_impl = (cmGlobalGenerator *)0x0;
        pcVar3 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                 _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                 super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&output,"CMAKE_GENERATOR_INSTANCE",(allocator<char> *)&projName);
        cVar12 = cmState::GetCacheEntryValue(pcVar3,&output);
        std::__cxx11::string::~string((string *)&output);
        if (cVar12.Value != (string *)0x0) {
          projName.field_2._M_allocated_capacity = (this->CurrentSnapshot).Position.Position;
          projName._M_dataplus._M_p = (pointer)(this->CurrentSnapshot).State;
          projName._M_string_length = (size_type)(this->CurrentSnapshot).Position.Tree;
          cmMakefile::cmMakefile
                    ((cmMakefile *)&output,
                     (this->GlobalGenerator)._M_t.
                     super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                     .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,
                     (cmStateSnapshot *)&projName);
          pcVar4 = (this->GlobalGenerator)._M_t.
                   super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                   .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
          iVar7 = (*pcVar4->_vptr_cmGlobalGenerator[8])(pcVar4,cVar12.Value,&output);
          cmMakefile::~cmMakefile((cmMakefile *)&output);
          if ((char)iVar7 == '\0') goto LAB_001f0732;
        }
        pcVar3 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                 _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                 super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&output,"CMAKE_GENERATOR_PLATFORM",(allocator<char> *)&projName);
        cVar12 = cmState::GetCacheEntryValue(pcVar3,&output);
        std::__cxx11::string::~string((string *)&output);
        if (cVar12.Value != (string *)0x0) {
          projName.field_2._M_allocated_capacity = (this->CurrentSnapshot).Position.Position;
          projName._M_dataplus._M_p = (pointer)(this->CurrentSnapshot).State;
          projName._M_string_length = (size_type)(this->CurrentSnapshot).Position.Tree;
          cmMakefile::cmMakefile
                    ((cmMakefile *)&output,
                     (this->GlobalGenerator)._M_t.
                     super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                     .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,
                     (cmStateSnapshot *)&projName);
          pcVar4 = (this->GlobalGenerator)._M_t.
                   super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                   .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
          iVar7 = (*pcVar4->_vptr_cmGlobalGenerator[9])(pcVar4,cVar12.Value,&output);
          cmMakefile::~cmMakefile((cmMakefile *)&output);
          if ((char)iVar7 == '\0') goto LAB_001f0732;
        }
        pcVar3 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                 _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                 super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&output,"CMAKE_GENERATOR_TOOLSET",(allocator<char> *)&projName);
        cVar12 = cmState::GetCacheEntryValue(pcVar3,&output);
        std::__cxx11::string::~string((string *)&output);
        if (cVar12.Value != (string *)0x0) {
          projName.field_2._M_allocated_capacity = (this->CurrentSnapshot).Position.Position;
          projName._M_dataplus._M_p = (pointer)(this->CurrentSnapshot).State;
          projName._M_string_length = (size_type)(this->CurrentSnapshot).Position.Tree;
          cmMakefile::cmMakefile
                    ((cmMakefile *)&output,
                     (this->GlobalGenerator)._M_t.
                     super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                     .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,
                     (cmStateSnapshot *)&projName);
          pcVar4 = (this->GlobalGenerator)._M_t.
                   super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                   .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
          iVar8 = 1;
          iVar7 = (*pcVar4->_vptr_cmGlobalGenerator[10])(pcVar4,cVar12.Value,1,&output);
          cmMakefile::~cmMakefile((cmMakefile *)&output);
          if ((char)iVar7 == '\0') goto LAB_001f0732;
        }
        output._M_dataplus._M_p = (pointer)&output.field_2;
        output._M_string_length = 0;
        projName._M_dataplus._M_p = (pointer)&projName.field_2;
        projName._M_string_length = 0;
        output.field_2._M_local_buf[0] = '\0';
        projName.field_2._M_allocated_capacity =
             projName.field_2._M_allocated_capacity & 0xffffffffffffff00;
        pcVar3 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                 _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                 super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_908,"CMAKE_PROJECT_NAME",(allocator<char> *)&local_848);
        cVar12 = cmState::GetCacheEntryValue(pcVar3,&local_908);
        std::__cxx11::string::~string((string *)&local_908);
        if (cVar12.Value == (string *)0x0) {
          std::operator<<((ostream *)&std::cerr,
                          "Error: could not find CMAKE_PROJECT_NAME in Cache\n");
LAB_001f0715:
          iVar8 = 1;
        }
        else {
          std::__cxx11::string::_M_assign((string *)&projName);
          pcVar3 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                   _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                   super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_908,"CMAKE_VERBOSE_MAKEFILE",(allocator<char> *)&local_848);
          cmState::GetCacheEntryValue(pcVar3,&local_908);
          bVar6 = cmIsOn((cmValue)0x1f058f);
          std::__cxx11::string::~string((string *)&local_908);
          pcVar4 = (this->GlobalGenerator)._M_t.
                   super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                   .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
          iVar8 = (*pcVar4->_vptr_cmGlobalGenerator[0xb])
                            (pcVar4,(this->State)._M_t.
                                    super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>
                                    .super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
          if ((char)iVar8 == '\0') goto LAB_001f0715;
          pcVar4 = (this->GlobalGenerator)._M_t.
                   super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                   .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
          (*pcVar4->_vptr_cmGlobalGenerator[0x14])(pcVar4,&std::cerr,local_8e0);
          pcVar4 = (this->GlobalGenerator)._M_t.
                   super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                   .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_908,"",&local_8e1);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_848,"",&local_8e2);
          iVar8 = cmGlobalGenerator::Build
                            (pcVar4,(int)local_8e0,&local_908,dir,&projName,targets,&output,
                             &local_848,config,buildOptions,(bool)(bVar6 | (byte)local_8e8 & 1),
                             (cmDuration)0x0,OUTPUT_PASSTHROUGH,nativeOptions);
          std::__cxx11::string::~string((string *)&local_848);
          std::__cxx11::string::~string((string *)&local_908);
        }
        std::__cxx11::string::~string((string *)&projName);
        std::__cxx11::string::~string((string *)&output);
      }
LAB_001f0732:
      if (local_8d0 != (undefined1  [8])0x0) {
        (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                     *)local_8d0)->
                  super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                  )._M_t.
                  super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                  .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[1].
                  _vptr_cmGlobalGeneratorFactory)();
      }
      goto LAB_001f0742;
    }
    std::operator<<((ostream *)&std::cerr,"Error: could not find CMAKE_GENERATOR in Cache\n");
  }
  else {
    std::operator<<((ostream *)&std::cerr,"Error: could not load cache\n");
  }
  iVar8 = 1;
LAB_001f0742:
  std::__cxx11::string::~string((string *)&cachePath);
  return iVar8;
}

Assistant:

int cmake::Build(int jobs, std::string dir, std::vector<std::string> targets,
                 std::string config, std::vector<std::string> nativeOptions,
                 cmBuildOptions& buildOptions, bool verbose,
                 const std::string& presetName, bool listPresets)
{
  this->SetHomeDirectory("");
  this->SetHomeOutputDirectory("");

#if !defined(CMAKE_BOOTSTRAP)
  if (!presetName.empty() || listPresets) {
    this->SetHomeDirectory(cmSystemTools::GetCurrentWorkingDirectory());
    this->SetHomeOutputDirectory(cmSystemTools::GetCurrentWorkingDirectory());

    cmCMakePresetsGraph settingsFile;
    auto result = settingsFile.ReadProjectPresets(this->GetHomeDirectory());
    if (result != cmCMakePresetsGraph::ReadFileResult::READ_OK) {
      cmSystemTools::Error(
        cmStrCat("Could not read presets from ", this->GetHomeDirectory(),
                 ": ", cmCMakePresetsGraph::ResultToString(result)));
      return 1;
    }

    if (listPresets) {
      settingsFile.PrintBuildPresetList();
      return 0;
    }

    auto presetPair = settingsFile.BuildPresets.find(presetName);
    if (presetPair == settingsFile.BuildPresets.end()) {
      cmSystemTools::Error(cmStrCat("No such build preset in ",
                                    this->GetHomeDirectory(), ": \"",
                                    presetName, '"'));
      settingsFile.PrintBuildPresetList();
      return 1;
    }

    if (presetPair->second.Unexpanded.Hidden) {
      cmSystemTools::Error(cmStrCat("Cannot use hidden build preset in ",
                                    this->GetHomeDirectory(), ": \"",
                                    presetName, '"'));
      settingsFile.PrintBuildPresetList();
      return 1;
    }

    auto const& expandedPreset = presetPair->second.Expanded;
    if (!expandedPreset) {
      cmSystemTools::Error(cmStrCat("Could not evaluate build preset \"",
                                    presetName,
                                    "\": Invalid macro expansion"));
      settingsFile.PrintBuildPresetList();
      return 1;
    }

    if (!expandedPreset->ConditionResult) {
      cmSystemTools::Error(cmStrCat("Cannot use disabled build preset in ",
                                    this->GetHomeDirectory(), ": \"",
                                    presetName, '"'));
      settingsFile.PrintBuildPresetList();
      return 1;
    }

    auto configurePresetPair =
      settingsFile.ConfigurePresets.find(expandedPreset->ConfigurePreset);
    if (configurePresetPair == settingsFile.ConfigurePresets.end()) {
      cmSystemTools::Error(cmStrCat("No such configure preset in ",
                                    this->GetHomeDirectory(), ": \"",
                                    expandedPreset->ConfigurePreset, '"'));
      this->PrintPresetList(settingsFile);
      return 1;
    }

    if (configurePresetPair->second.Unexpanded.Hidden) {
      cmSystemTools::Error(cmStrCat("Cannot use hidden configure preset in ",
                                    this->GetHomeDirectory(), ": \"",
                                    expandedPreset->ConfigurePreset, '"'));
      this->PrintPresetList(settingsFile);
      return 1;
    }

    auto const& expandedConfigurePreset = configurePresetPair->second.Expanded;
    if (!expandedConfigurePreset) {
      cmSystemTools::Error(cmStrCat("Could not evaluate configure preset \"",
                                    expandedPreset->ConfigurePreset,
                                    "\": Invalid macro expansion"));
      return 1;
    }

    if (!expandedConfigurePreset->BinaryDir.empty()) {
      dir = expandedConfigurePreset->BinaryDir;
    }

    this->UnprocessedPresetEnvironment = expandedPreset->Environment;
    this->ProcessPresetEnvironment();

    if ((jobs == cmake::DEFAULT_BUILD_PARALLEL_LEVEL ||
         jobs == cmake::NO_BUILD_PARALLEL_LEVEL) &&
        expandedPreset->Jobs) {
      jobs = *expandedPreset->Jobs;
    }

    if (targets.empty()) {
      targets.insert(targets.begin(), expandedPreset->Targets.begin(),
                     expandedPreset->Targets.end());
    }

    if (config.empty()) {
      config = expandedPreset->Configuration;
    }

    if (!buildOptions.Clean && expandedPreset->CleanFirst) {
      buildOptions.Clean = *expandedPreset->CleanFirst;
    }

    if (buildOptions.ResolveMode == PackageResolveMode::Default &&
        expandedPreset->ResolvePackageReferences) {
      buildOptions.ResolveMode = *expandedPreset->ResolvePackageReferences;
    }

    if (!verbose && expandedPreset->Verbose) {
      verbose = *expandedPreset->Verbose;
    }

    if (nativeOptions.empty()) {
      nativeOptions.insert(nativeOptions.begin(),
                           expandedPreset->NativeToolOptions.begin(),
                           expandedPreset->NativeToolOptions.end());
    }
  }
#endif

  if (!cmSystemTools::FileIsDirectory(dir)) {
    std::cerr << "Error: " << dir << " is not a directory\n";
    return 1;
  }

  std::string cachePath = FindCacheFile(dir);
  if (!this->LoadCache(cachePath)) {
    std::cerr << "Error: could not load cache\n";
    return 1;
  }
  cmValue cachedGenerator = this->State->GetCacheEntryValue("CMAKE_GENERATOR");
  if (!cachedGenerator) {
    std::cerr << "Error: could not find CMAKE_GENERATOR in Cache\n";
    return 1;
  }
  auto gen = this->CreateGlobalGenerator(*cachedGenerator);
  if (!gen) {
    std::cerr << "Error: could not create CMAKE_GENERATOR \""
              << *cachedGenerator << "\"\n";
    return 1;
  }
  this->SetGlobalGenerator(std::move(gen));
  cmValue cachedGeneratorInstance =
    this->State->GetCacheEntryValue("CMAKE_GENERATOR_INSTANCE");
  if (cachedGeneratorInstance) {
    cmMakefile mf(this->GetGlobalGenerator(), this->GetCurrentSnapshot());
    if (!this->GlobalGenerator->SetGeneratorInstance(*cachedGeneratorInstance,
                                                     &mf)) {
      return 1;
    }
  }
  cmValue cachedGeneratorPlatform =
    this->State->GetCacheEntryValue("CMAKE_GENERATOR_PLATFORM");
  if (cachedGeneratorPlatform) {
    cmMakefile mf(this->GetGlobalGenerator(), this->GetCurrentSnapshot());
    if (!this->GlobalGenerator->SetGeneratorPlatform(*cachedGeneratorPlatform,
                                                     &mf)) {
      return 1;
    }
  }
  cmValue cachedGeneratorToolset =
    this->State->GetCacheEntryValue("CMAKE_GENERATOR_TOOLSET");
  if (cachedGeneratorToolset) {
    cmMakefile mf(this->GetGlobalGenerator(), this->GetCurrentSnapshot());
    if (!this->GlobalGenerator->SetGeneratorToolset(*cachedGeneratorToolset,
                                                    true, &mf)) {
      return 1;
    }
  }
  std::string output;
  std::string projName;
  cmValue cachedProjectName =
    this->State->GetCacheEntryValue("CMAKE_PROJECT_NAME");
  if (!cachedProjectName) {
    std::cerr << "Error: could not find CMAKE_PROJECT_NAME in Cache\n";
    return 1;
  }
  projName = *cachedProjectName;

  if (cmIsOn(this->State->GetCacheEntryValue("CMAKE_VERBOSE_MAKEFILE"))) {
    verbose = true;
  }

#ifdef CMAKE_HAVE_VS_GENERATORS
  // For VS generators, explicitly check if regeneration is necessary before
  // actually starting the build. If not done separately from the build
  // itself, there is the risk of building an out-of-date solution file due
  // to limitations of the underlying build system.
  std::string const stampList = cachePath + "/" + "CMakeFiles/" +
    cmGlobalVisualStudio9Generator::GetGenerateStampList();

  // Note that the stampList file only exists for VS generators.
  if (cmSystemTools::FileExists(stampList)) {

    // Check if running for Visual Studio 9 - we need to explicitly run
    // the glob verification script before starting the build
    this->AddScriptingCommands();
    if (this->GlobalGenerator->MatchesGeneratorName("Visual Studio 9 2008")) {
      std::string const globVerifyScript =
        cachePath + "/" + "CMakeFiles/" + "VerifyGlobs.cmake";
      if (cmSystemTools::FileExists(globVerifyScript)) {
        std::vector<std::string> args;
        this->ReadListFile(args, globVerifyScript);
      }
    }

    if (!cmakeCheckStampList(stampList)) {
      // Correctly initialize the home (=source) and home output (=binary)
      // directories, which is required for running the generation step.
      std::string homeOrig = this->GetHomeDirectory();
      std::string homeOutputOrig = this->GetHomeOutputDirectory();
      this->SetDirectoriesFromFile(cachePath);

      this->AddProjectCommands();

      int ret = this->Configure();
      if (ret) {
        cmSystemTools::Message("CMake Configure step failed.  "
                               "Build files cannot be regenerated correctly.");
        return ret;
      }
      ret = this->Generate();
      if (ret) {
        cmSystemTools::Message("CMake Generate step failed.  "
                               "Build files cannot be regenerated correctly.");
        return ret;
      }
      std::string message = cmStrCat("Build files have been written to: ",
                                     this->GetHomeOutputDirectory());
      this->UpdateProgress(message, -1);

      // Restore the previously set directories to their original value.
      this->SetHomeDirectory(homeOrig);
      this->SetHomeOutputDirectory(homeOutputOrig);
    }
  }
#endif

  if (!this->GlobalGenerator->ReadCacheEntriesForBuild(*this->State)) {
    return 1;
  }

  this->GlobalGenerator->PrintBuildCommandAdvice(std::cerr, jobs);
  return this->GlobalGenerator->Build(
    jobs, "", dir, projName, targets, output, "", config, buildOptions,
    verbose, cmDuration::zero(), cmSystemTools::OUTPUT_PASSTHROUGH,
    nativeOptions);
}